

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O2

void __thiscall
duckdb::TupleDataCollection::Combine(TupleDataCollection *this,TupleDataCollection *other)

{
  pointer pTVar1;
  bool bVar2;
  InternalException *this_00;
  TupleDataSegment *other_seg;
  pointer segment;
  allocator local_49;
  string local_48;
  
  if (other->count == 0) {
    return;
  }
  bVar2 = ::std::operator!=((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                            this->layout,
                            (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                            other->layout);
  if (!bVar2) {
    ::std::vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>::reserve
              (&(this->segments).
                super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>,
               ((long)(this->segments).
                      super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                      .
                      super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->segments).
                     super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                     .
                     super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xb0 +
               ((long)(other->segments).
                      super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                      .
                      super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(other->segments).
                     super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                     .
                     super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xb0);
    pTVar1 = (other->segments).
             super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
             super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (segment = (other->segments).
                   super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                   .
                   super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                   ._M_impl.super__Vector_impl_data._M_start; segment != pTVar1;
        segment = segment + 1) {
      AddSegment(this,segment);
    }
    Reset(other);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,"Attempting to combine TupleDataCollection with mismatching types",
             &local_49);
  InternalException::InternalException(this_00,&local_48);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TupleDataCollection::Combine(TupleDataCollection &other) {
	if (other.count == 0) {
		return;
	}
	if (this->layout.GetTypes() != other.GetLayout().GetTypes()) {
		throw InternalException("Attempting to combine TupleDataCollection with mismatching types");
	}
	this->segments.reserve(this->segments.size() + other.segments.size());
	for (auto &other_seg : other.segments) {
		AddSegment(std::move(other_seg));
	}
	other.Reset();
}